

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_mnist.hpp
# Opt level: O1

void pico_tree::read_mnist_images
               (string *filename,
               vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
               *images)

{
  undefined1 auVar1 [13];
  uint3 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  ulong uVar10;
  uint5 uVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [13];
  undefined1 auVar16 [15];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  runtime_error *prVar22;
  undefined4 uVar25;
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  undefined4 uVar34;
  header header;
  big_endian<int> magic_number;
  fstream stream;
  uint local_248;
  uint local_244;
  uint local_240;
  int local_23c;
  int local_238;
  undefined4 uStack_234;
  uint uStack_230;
  undefined4 uStack_22c;
  string local_220 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [16];
  
  internal::open_stream(local_220,(openmode)filename);
  ::std::istream::read((char *)local_220,(long)&local_23c);
  auVar1[0xc] = (char)((uint)local_23c >> 0x18);
  auVar1._0_12_ = ZEXT712(0);
  uVar11 = CONCAT32(auVar1._10_3_,(ushort)(byte)((uint)local_23c >> 0x10));
  auVar17._5_8_ = 0;
  auVar17._0_5_ = uVar11;
  uVar2 = auVar1._10_3_ >> 0x10;
  uVar25 = (undefined4)(((ulong)uVar11 & 0xffffffff) * 0x100);
  auVar19._4_4_ = uVar25;
  auVar19._0_4_ = local_23c * 0x1000000;
  local_238 = 0x10000;
  uStack_234 = 0x10000;
  uStack_230 = 1;
  uStack_22c = 1;
  auVar19._8_4_ = uVar25;
  auVar19._12_3_ = uVar2;
  auVar21._4_4_ =
       (int)CONCAT72(SUB137(auVar17 << 0x40,6),(ushort)(byte)((uint)local_23c >> 8)) * 0x10000;
  auVar21._0_4_ = local_23c * 0x1000000;
  auVar21._8_7_ = auVar19._8_7_;
  auVar20._4_3_ = uVar2;
  auVar20._0_4_ = uVar25;
  auVar20[7] = 0;
  auVar20._8_4_ = uVar25;
  auVar20._12_3_ = uVar2;
  if ((SUB154(auVar20 | auVar21,4) | SUB154(auVar20 | auVar21,0)) != 0x803) {
    prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar22,"expected mnist images signature");
    __cxa_throw(prVar22,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::istream::read((char *)local_220,(long)&local_248);
  auVar3[0xc] = (char)(local_248 >> 0x18);
  auVar3._0_12_ = ZEXT712(0);
  uVar11 = CONCAT32(auVar3._10_3_,(ushort)(byte)(local_248 >> 0x10));
  auVar18._5_8_ = 0;
  auVar18._0_5_ = uVar11;
  uVar2 = auVar3._10_3_ >> 0x10;
  auVar12._12_3_ = uVar2;
  auVar12._0_12_ = ZEXT312(uVar2) << 0x40;
  auVar23._0_4_ = local_248 * 0x1000000;
  auVar24._8_4_ = (undefined4)(((ulong)uVar11 & 0xffffffff) * 0x100);
  auVar24._4_4_ = auVar24._8_4_;
  auVar24._0_4_ = auVar23._0_4_;
  uVar25 = (undefined4)(((ulong)auVar12._8_7_ & 0xffffffff) * (ulong)uStack_230);
  auVar24._12_4_ = uVar25;
  auVar23._8_8_ = auVar24._8_8_;
  auVar23._4_4_ =
       (int)CONCAT72(SUB137(auVar18 << 0x40,6),(ushort)(byte)(local_248 >> 8)) * local_238;
  auVar28._4_4_ = uVar25;
  auVar28._0_4_ = auVar24._8_4_;
  auVar28._8_4_ = auVar24._8_4_;
  auVar28._12_4_ = uVar25;
  local_248 = SUB164(auVar28 | auVar23,4) | SUB164(auVar28 | auVar23,0);
  uVar10 = (ulong)(ushort)local_244 & 0xffffffffffff00ff;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar10;
  auVar4[0xc] = (char)(local_244 >> 0x18);
  auVar5[8] = (char)(local_244 >> 0x10);
  auVar5._0_8_ = uVar10;
  auVar5[9] = 0;
  auVar5._10_3_ = auVar4._10_3_;
  auVar13._5_8_ = 0;
  auVar13._0_5_ = auVar5._8_5_;
  auVar6[4] = (char)(local_244 >> 8);
  auVar6._0_4_ = (int)uVar10;
  auVar6[5] = 0;
  auVar6._6_7_ = SUB137(auVar13 << 0x40,6);
  uVar2 = auVar4._10_3_ >> 0x10;
  auVar14._12_3_ = uVar2;
  auVar14._0_12_ = ZEXT312(uVar2) << 0x40;
  auVar29._0_4_ = (int)uVar10 * 0x1000000;
  auVar30._8_4_ = (undefined4)(((ulong)auVar5._8_5_ & 0xffffffff) * 0x100);
  auVar30._4_4_ = auVar30._8_4_;
  auVar30._0_4_ = auVar29._0_4_;
  uVar25 = (undefined4)(((ulong)auVar14._8_7_ & 0xffffffff) * (ulong)uStack_230);
  auVar30._12_4_ = uVar25;
  auVar29._8_8_ = auVar30._8_8_;
  auVar29._4_4_ = auVar6._4_4_ * local_238;
  auVar32._4_4_ = uVar25;
  auVar32._0_4_ = auVar30._8_4_;
  auVar32._8_4_ = auVar30._8_4_;
  auVar32._12_4_ = uVar25;
  local_244 = SUB164(auVar32 | auVar29,4) | SUB164(auVar32 | auVar29,0);
  uVar10 = (ulong)(ushort)local_240 & 0xffffffffffff00ff;
  auVar7._8_4_ = 0;
  auVar7._0_8_ = uVar10;
  auVar7[0xc] = (char)(local_240 >> 0x18);
  auVar8[8] = (char)(local_240 >> 0x10);
  auVar8._0_8_ = uVar10;
  auVar8[9] = 0;
  auVar8._10_3_ = auVar7._10_3_;
  auVar15._5_8_ = 0;
  auVar15._0_5_ = auVar8._8_5_;
  auVar9[4] = (char)(local_240 >> 8);
  auVar9._0_4_ = (int)uVar10;
  auVar9[5] = 0;
  auVar9._6_7_ = SUB137(auVar15 << 0x40,6);
  iVar33 = (int)uVar10 * 0x1000000;
  uVar34 = (undefined4)(((ulong)auVar8._8_5_ & 0xffffffff) * 0x100);
  auVar27._4_4_ = uVar34;
  auVar27._0_4_ = iVar33;
  uVar2 = auVar7._10_3_ >> 0x10;
  auVar16._12_3_ = uVar2;
  auVar16._0_12_ = ZEXT312(uVar2) << 0x40;
  uVar25 = (undefined4)(((ulong)auVar16._8_7_ & 0xffffffff) * (ulong)uStack_230);
  auVar27._8_4_ = uVar34;
  auVar27._12_4_ = uVar25;
  auVar26._8_8_ = auVar27._8_8_;
  auVar26._4_4_ = auVar9._4_4_ * local_238;
  auVar26._0_4_ = iVar33;
  auVar31._4_4_ = uVar25;
  auVar31._0_4_ = uVar34;
  auVar31._8_4_ = uVar34;
  auVar31._12_4_ = uVar25;
  local_240 = SUB164(auVar31 | auVar26,4) | SUB164(auVar31 | auVar26,0);
  if (local_240 * local_244 == 0x310) {
    std::vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::
    resize(images,(long)(int)local_248);
    ::std::istream::read
              ((char *)local_220,
               (long)(images->
                     super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
    ::std::fstream::~fstream(local_220);
    return;
  }
  prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(prVar22,"unexpected mnist image dimensions");
  __cxa_throw(prVar22,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline void read_mnist_images(
    std::string const& filename,
    std::vector<std::array<std::byte, 28 * 28>>& images) {
  using namespace internal;

  std::fstream stream = open_stream(filename, std::ios::in | std::ios::binary);
  stream_wrapper wrapper(stream);

  big_endian<std::int32_t> magic_number;
  wrapper.read(magic_number);
  if (magic_number() != mnist_images::header::magic_number) {
    throw std::runtime_error("expected mnist images signature");
  }

  mnist_images::header header;
  wrapper.read(header);
  header.image_count = big_endian<std::int32_t>{header.image_count};
  header.image_width = big_endian<std::int32_t>{header.image_width};
  header.image_height = big_endian<std::int32_t>{header.image_height};

  if (header.image_width * header.image_height != 28 * 28) {
    throw std::runtime_error("unexpected mnist image dimensions");
  }

  images.resize(static_cast<std::size_t>(header.image_count));
  wrapper.read(images.size(), images.data());
}